

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdrloader.cpp
# Opt level: O3

bool HDRLoader::load(char *fileName,HDRLoaderResult *res)

{
  byte bVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  FILE *__stream;
  float *pfVar9;
  uchar *scanline;
  long lVar10;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  char *pcVar15;
  uchar *puVar16;
  float *pfVar17;
  double dVar18;
  int w;
  int h;
  char reso [200];
  char str [200];
  uint local_204;
  ulong local_200;
  undefined4 local_1f8;
  uint local_1f4;
  float *local_1f0;
  uchar *local_1e8;
  RGBE *local_1e0;
  uchar *local_1d8;
  long local_1d0;
  char local_1c8 [208];
  long local_f8;
  short local_f0;
  
  __stream = fopen(fileName,"rb");
  if (__stream != (FILE *)0x0) {
    fread(&local_f8,10,1,__stream);
    if (local_f0 == 0x4543 && local_f8 == 0x4e41494441523f23) {
      fseek(__stream,1,1);
      iVar5 = 0;
      do {
        iVar4 = fgetc(__stream);
        cVar11 = (char)iVar5;
        iVar5 = iVar4;
      } while (cVar11 != '\n' || (char)iVar4 != '\n');
      pcVar15 = local_1c8;
      do {
        iVar5 = fgetc(__stream);
        *pcVar15 = (char)iVar5;
        pcVar15 = pcVar15 + 1;
      } while ((char)iVar5 != '\n');
      iVar5 = __isoc99_sscanf(local_1c8,"-Y %d +X %d",&local_1f4,&local_204);
      uVar2 = CONCAT31((int3)((uint)iVar4 >> 8),iVar5 != 0);
      if (iVar5 != 0) {
        uVar13 = (ulong)(int)local_204;
        res->width = local_204;
        res->height = local_1f4;
        uVar12 = (long)(int)(local_1f4 * local_204 * 3) << 2;
        if ((int)(local_1f4 * local_204) < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        local_1f8 = uVar2;
        pfVar9 = (float *)operator_new__(uVar12);
        uVar12 = uVar13 * 4;
        res->cols = pfVar9;
        if ((long)uVar13 < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        scanline = (uchar *)operator_new__(uVar12);
        if (0 < (int)local_1f4) {
          local_1d8 = scanline + 3;
          local_1e0 = (RGBE *)(scanline + 4);
          local_1e8 = scanline;
          do {
            uVar12 = (ulong)local_1f4;
            iVar5 = (int)uVar13;
            if (iVar5 - 0x8000U < 0xffff8008) {
LAB_001c5d50:
              bVar3 = oldDecrunch((RGBE *)scanline,iVar5,(FILE *)__stream);
LAB_001c5d5e:
              if (bVar3 == false) break;
            }
            else {
              iVar4 = fgetc(__stream);
              if (iVar4 != 2) {
                fseek(__stream,-1,1);
                goto LAB_001c5d50;
              }
              local_1f0 = pfVar9;
              iVar4 = fgetc(__stream);
              scanline[1] = (uchar)iVar4;
              iVar6 = fgetc(__stream);
              scanline[2] = (uchar)iVar6;
              iVar7 = fgetc(__stream);
              if ((char)(uchar)iVar6 < '\0' || (uchar)iVar4 != '\x02') {
                *scanline = 2;
                scanline[3] = (char)iVar7;
                bVar3 = oldDecrunch(local_1e0,iVar5 + -1,(FILE *)__stream);
                pfVar9 = local_1f0;
                goto LAB_001c5d5e;
              }
              lVar10 = 0;
              local_200 = uVar12;
              do {
                iVar4 = 0;
                local_1d0 = lVar10;
                do {
                  uVar8 = fgetc(__stream);
                  bVar14 = (byte)uVar8;
                  if ((uVar8 & 0xff) < 0x81) {
                    if (bVar14 != 0) {
                      lVar10 = 0;
                      do {
                        iVar6 = fgetc(__stream);
                        scanline[lVar10 * 4 + (long)iVar4 * 4] = (uchar)iVar6;
                        lVar10 = lVar10 + 1;
                      } while (bVar14 != (byte)lVar10);
                      iVar4 = iVar4 + (int)lVar10;
                    }
                  }
                  else {
                    iVar6 = fgetc(__stream);
                    if ((uVar8 & 0x7f) != 0) {
                      lVar10 = 0;
                      do {
                        scanline[lVar10 * 4 + (long)iVar4 * 4] = (uchar)iVar6;
                        lVar10 = lVar10 + 1;
                      } while ((bVar14 & 0x7f) != (byte)lVar10);
                      iVar4 = iVar4 + (int)lVar10;
                    }
                  }
                } while (iVar4 < iVar5);
                scanline = scanline + 1;
                lVar10 = local_1d0 + 1;
              } while (lVar10 != 4);
              iVar5 = feof(__stream);
              pfVar9 = local_1f0;
              scanline = local_1e8;
              uVar12 = local_200;
              if (iVar5 != 0) break;
            }
            if (0 < (int)local_204) {
              uVar8 = local_204 + 1;
              puVar16 = local_1d8;
              pfVar17 = pfVar9;
              local_200 = uVar12;
              do {
                bVar14 = (*(RGBE *)(puVar16 + -3))[0];
                iVar5 = *puVar16 - 0x80;
                dVar18 = ldexp(1.0,iVar5);
                bVar1 = puVar16[-2];
                *pfVar17 = (float)dVar18 * (float)bVar14 * 0.00390625;
                dVar18 = ldexp(1.0,iVar5);
                bVar14 = puVar16[-1];
                pfVar17[1] = (float)dVar18 * (float)bVar1 * 0.00390625;
                dVar18 = ldexp(1.0,iVar5);
                puVar16 = puVar16 + 4;
                uVar8 = uVar8 - 1;
                pfVar17[2] = (float)dVar18 * (float)bVar14 * 0.00390625;
                pfVar17 = pfVar17 + 3;
                scanline = local_1e8;
                uVar12 = local_200;
              } while (1 < uVar8);
            }
            uVar13 = (ulong)local_204;
            local_1f4 = (int)uVar12 - 1;
            pfVar9 = pfVar9 + (int)(local_204 * 3);
          } while (1 < (int)uVar12);
        }
        operator_delete__(scanline);
        uVar2 = local_1f8;
      }
      fclose(__stream);
      return (bool)(char)uVar2;
    }
    fclose(__stream);
  }
  return false;
}

Assistant:

bool HDRLoader::load(const char *fileName, HDRLoaderResult &res)
{
	int i;
	char str[200];
	FILE *file;

	file = fopen(fileName, "rb");
	if (!file)
		return false;

	fread(str, 10, 1, file);
	if (memcmp(str, "#?RADIANCE", 10)) {
		fclose(file);
		return false;
	}

	fseek(file, 1, SEEK_CUR);

	char cmd[200];
	i = 0;
	char c = 0, oldc;
	while(true) {
		oldc = c;
		c = fgetc(file);
		if (c == 0xa && oldc == 0xa)
			break;
		cmd[i++] = c;
	}

	char reso[200];
	i = 0;
	while(true) {
		c = fgetc(file);
		reso[i++] = c;
		if (c == 0xa)
			break;
	}

	int w, h;
	if (!sscanf(reso, "-Y %d +X %d", &h, &w)) {
		fclose(file);
		return false;
	}

	res.width = w;
	res.height = h;

	float *cols = new float[w * h * 3];
	res.cols = cols;

	RGBE *scanline = new RGBE[w];
	if (!scanline) {
		fclose(file);
		return false;
	}

	// convert image 
	for (int y = h - 1; y >= 0; y--) {
		if (decrunch(scanline, w, file) == false)
			break;
		workOnRGBE(scanline, w, cols);
		cols += w * 3;
	}

	delete [] scanline;
	fclose(file);

	return true;
}